

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::setCurrentIndex(QComboBoxPrivate *this,QModelIndex *mi)

{
  QPersistentModelIndex *this_00;
  QWidget *this_01;
  QAbstractItemModel *pQVar1;
  QArrayData *pQVar2;
  char cVar3;
  byte bVar4;
  SelectionBehavior SVar5;
  QCompleter *pQVar6;
  QComboBoxPrivateContainer *pQVar7;
  QItemSelectionModel *pQVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QString local_90;
  QArrayData *local_78;
  storage_type_conflict *psStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (mi->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48.ptr = (QAbstractItemModel *)0x0;
  }
  else if (mi->c == this->modelColumn) {
    local_48.ptr = (mi->m).ptr;
    local_58 = *(undefined1 **)mi;
    puStack_50 = (undefined1 *)mi->i;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x70))(&local_58,pQVar1,mi->r,this->modelColumn,mi);
  }
  if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48.ptr == (QAbstractItemModel *)0x0))
  {
    local_48.ptr = (mi->m).ptr;
    local_58 = *(undefined1 **)mi;
    puStack_50 = (undefined1 *)mi->i;
  }
  this_00 = &this->currentIndex;
  cVar3 = comparesEqual(this_00,(QModelIndex *)&local_58);
  if (cVar3 == '\0') {
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)&local_78,(QModelIndex *)&local_58);
    pQVar2 = (QArrayData *)this_00->d;
    this_00->d = (QPersistentModelIndexData *)local_78;
    local_78 = pQVar2;
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
  }
  if (this->lineEdit != (QLineEdit *)0x0) {
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    psStack_70 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    itemText((QString *)&local_78,this,(QModelIndex *)&local_58);
    QLineEdit::text(&local_90,this->lineEdit);
    bVar4 = 1;
    if ((QAbstractItemModel *)local_90.d.size == local_68.ptr) {
      QVar9.m_data = local_90.d.ptr;
      QVar9.m_size = local_90.d.size;
      QVar10.m_data = psStack_70;
      QVar10.m_size = local_90.d.size;
      bVar4 = QtPrivate::equalStrings(QVar9,QVar10);
      bVar4 = bVar4 ^ 1;
    }
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar4 != 0) {
      QLineEdit::setText(this->lineEdit,(QString *)&local_78);
      if ((this->lineEdit != (QLineEdit *)0x0) &&
         (pQVar6 = QLineEdit::completer(this->lineEdit), pQVar6 != (QCompleter *)0x0)) {
        pQVar6 = QLineEdit::completer(this->lineEdit);
        QCompleter::setCompletionPrefix(pQVar6,(QString *)&local_78);
      }
    }
    updateLineEditGeometry(this);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
  }
  if (((int)local_58 < 0) || ((long)local_58 < 0)) {
    if (this->indexBeforeChange == -1) goto LAB_003d3536;
LAB_003d354d:
    this->indexBeforeChange = -1;
  }
  else {
    if ((local_48.ptr == (QAbstractItemModel *)0x0) && (this->indexBeforeChange != -1))
    goto LAB_003d354d;
LAB_003d3536:
    if (cVar3 != '\0') goto LAB_003d35dd;
  }
  pQVar7 = viewContainer(*(QComboBoxPrivate **)&this_01->field_0x8);
  SVar5 = QAbstractItemView::selectionBehavior((QAbstractItemView *)pQVar7->view);
  pQVar7 = viewContainer(*(QComboBoxPrivate **)&this_01->field_0x8);
  pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)pQVar7->view);
  if (pQVar8 != (QItemSelectionModel *)0x0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
    (**(code **)(*(long *)pQVar8 + 0x60))
              (pQVar8,(QModelIndex *)&local_78,(uint)(SVar5 == SelectRows) << 5 | 3);
  }
  QWidget::update(this_01);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
  emitCurrentIndexChanged(this,(QModelIndex *)&local_78);
LAB_003d35dd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::setCurrentIndex(const QModelIndex &mi)
{
    Q_Q(QComboBox);

    QModelIndex normalized = mi.sibling(mi.row(), modelColumn); // no-op if mi.column() == modelColumn
    if (!normalized.isValid())
        normalized = mi;    // Fallback to passed index.

    bool indexChanged = (normalized != currentIndex);
    if (indexChanged)
        currentIndex = QPersistentModelIndex(normalized);
    if (lineEdit) {
        const QString newText = itemText(normalized);
        if (lineEdit->text() != newText) {
            lineEdit->setText(newText); // may cause lineEdit -> nullptr (QTBUG-54191)
#if QT_CONFIG(completer)
            if (lineEdit && lineEdit->completer())
                lineEdit->completer()->setCompletionPrefix(newText);
#endif
        }
        updateLineEditGeometry();
    }
    // If the model was reset to an empty one, currentIndex will be invalidated
    // (because it's a QPersistentModelIndex), but the index change will never
    // be advertised. So an explicit check for this condition is needed.
    // The variable used for that check has to be reset when a previously valid
    // index becomes invalid.
    const bool modelResetToEmpty = !normalized.isValid() && indexBeforeChange != -1;
    if (modelResetToEmpty)
        indexBeforeChange = -1;

    if (indexChanged || modelResetToEmpty) {
        QItemSelectionModel::SelectionFlags selectionMode = QItemSelectionModel::ClearAndSelect;
        if (q->view()->selectionBehavior() == QAbstractItemView::SelectRows)
            selectionMode.setFlag(QItemSelectionModel::Rows);
        if (auto *model = q->view()->selectionModel())
            model->setCurrentIndex(currentIndex, selectionMode);

        q->update();
        emitCurrentIndexChanged(currentIndex);
    }
}